

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommandArguments.cxx
# Opt level: O3

void __thiscall
cmInstallCommandArguments::cmInstallCommandArguments
          (cmInstallCommandArguments *this,string *defaultComponent)

{
  cmCommandArgumentGroup *group;
  pointer pcVar1;
  
  group = &this->ArgumentGroup;
  (this->ArgumentGroup).ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ArgumentGroup).ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Parser).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ArgumentGroup).ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Parser).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Parser).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  cmCAString::cmCAString(&this->Destination,&this->Parser,"DESTINATION",group);
  cmCAString::cmCAString(&this->Component,&this->Parser,"COMPONENT",group);
  cmCAString::cmCAString(&this->Rename,&this->Parser,"RENAME",group);
  cmCAStringVector::cmCAStringVector(&this->Permissions,&this->Parser,"PERMISSIONS",group);
  cmCAStringVector::cmCAStringVector(&this->Configurations,&this->Parser,"CONFIGURATIONS",group);
  cmCAEnabler::cmCAEnabler(&this->Optional,&this->Parser,"OPTIONAL",group);
  cmCAEnabler::cmCAEnabler(&this->NamelinkOnly,&this->Parser,"NAMELINK_ONLY",group);
  cmCAEnabler::cmCAEnabler(&this->NamelinkSkip,&this->Parser,"NAMELINK_SKIP",group);
  (this->DestinationString)._M_dataplus._M_p = (pointer)&(this->DestinationString).field_2;
  (this->DestinationString)._M_string_length = 0;
  (this->DestinationString).field_2._M_local_buf[0] = '\0';
  (this->PermissionsString)._M_dataplus._M_p = (pointer)&(this->PermissionsString).field_2;
  (this->PermissionsString)._M_string_length = 0;
  (this->PermissionsString).field_2._M_local_buf[0] = '\0';
  this->GenericArguments = (cmInstallCommandArguments *)0x0;
  (this->DefaultComponentName)._M_dataplus._M_p = (pointer)&(this->DefaultComponentName).field_2;
  pcVar1 = (defaultComponent->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->DefaultComponentName,pcVar1,
             pcVar1 + defaultComponent->_M_string_length);
  return;
}

Assistant:

cmInstallCommandArguments::cmInstallCommandArguments(
                                           const std::string& defaultComponent)
:Parser()
,ArgumentGroup()
,Destination   (&Parser, "DESTINATION"   , &ArgumentGroup)
,Component     (&Parser, "COMPONENT"     , &ArgumentGroup)
,Rename        (&Parser, "RENAME"        , &ArgumentGroup)
,Permissions   (&Parser, "PERMISSIONS"   , &ArgumentGroup)
,Configurations(&Parser, "CONFIGURATIONS", &ArgumentGroup)
,Optional      (&Parser, "OPTIONAL"      , &ArgumentGroup)
,NamelinkOnly  (&Parser, "NAMELINK_ONLY" , &ArgumentGroup)
,NamelinkSkip  (&Parser, "NAMELINK_SKIP" , &ArgumentGroup)
,GenericArguments(0)
,DefaultComponentName(defaultComponent)
{
}